

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int fits_get_token(char **ptr,char *delimiter,char *token,int *isanumber)

{
  size_t sVar1;
  int *piVar2;
  char *pcVar3;
  int iVar4;
  char *loc;
  char tval [73];
  
  *token = '\0';
  pcVar3 = *ptr;
  while (*pcVar3 == ' ') {
    pcVar3 = pcVar3 + 1;
    *ptr = pcVar3;
  }
  sVar1 = strcspn(pcVar3,delimiter);
  iVar4 = (int)sVar1;
  if (iVar4 != 0) {
    strncat(token,pcVar3,(long)iVar4);
    *ptr = *ptr + iVar4;
    if (isanumber != (int *)0x0) {
      *isanumber = 1;
      pcVar3 = strchr(token,0x44);
      if (pcVar3 != (char *)0x0) {
        strncpy(tval,token,0x48);
        tval[0x48] = '\0';
        loc = strchr(tval,0x44);
        token = tval;
        if (loc != (char *)0x0) {
          *loc = 'E';
        }
      }
      strtod(token,&loc);
      if ((*loc & 0xdfU) != 0) {
        *isanumber = 0;
      }
      piVar2 = __errno_location();
      if (*piVar2 == 0x22) {
        *isanumber = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int fits_get_token(char **ptr, 
                   char *delimiter,
                   char *token,
                   int *isanumber)   /* O - is this token a number? */
/*
   parse off the next token, delimited by a character in 'delimiter',
   from the input ptr string;  increment *ptr to the end of the token.
   Returns the length of the token, not including the delimiter char;
*/
{
    char *loc, tval[73];
    int slen;
    double dval;
    
    *token = '\0';

    while (**ptr == ' ')  /* skip over leading blanks */
        (*ptr)++;

    slen = strcspn(*ptr, delimiter);  /* length of next token */
    if (slen)
    {
        strncat(token, *ptr, slen);       /* copy token */

        (*ptr) += slen;                   /* skip over the token */

        if (isanumber)  /* check if token is a number */
        {
            *isanumber = 1;

	    if (strchr(token, 'D'))  {
	        strncpy(tval, token, 72);
		tval[72] = '\0';

	        /*  The C language does not support a 'D'; replace with 'E' */
	        if ((loc = strchr(tval, 'D'))) *loc = 'E';

	        dval =  strtod(tval, &loc);
	    } else {
	        dval =  strtod(token, &loc);
 	    }

	    /* check for read error, or junk following the value */
	    if (*loc != '\0' && *loc != ' ' ) *isanumber = 0;
	    if (errno == ERANGE) *isanumber = 0;
        }
    }

    return(slen);
}